

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_slice.c
# Opt level: O2

int h264_mb_slice_group(h264_slice *slice,uint32_t mbaddr)

{
  uint uVar1;
  int iVar2;
  
  iVar2 = 0;
  if ((mbaddr < slice->pic_size_in_mbs) && (iVar2 = 0, slice->picparm->num_slice_groups_minus1 != 0)
     ) {
    if ((slice->seqparm->frame_mbs_only_flag == 0) && (slice->field_pic_flag == 0)) {
      if (slice->mbaff_frame_flag == 0) {
        mbaddr = mbaddr >> 1;
      }
      else {
        uVar1 = slice->pic_width_in_mbs;
        mbaddr = ((int)(mbaddr / uVar1) / 2) * uVar1 + mbaddr % uVar1;
      }
    }
    iVar2 = slice->sgmap[mbaddr];
  }
  return iVar2;
}

Assistant:

int h264_mb_slice_group(struct h264_slice *slice, uint32_t mbaddr) {
	if (mbaddr < 0 || mbaddr >= slice->pic_size_in_mbs)
		return 0;
	if (!slice->picparm->num_slice_groups_minus1)
		return 0;
	int ret;
	if (slice->seqparm->frame_mbs_only_flag || slice->field_pic_flag) {
		ret = slice->sgmap[mbaddr];
	} else if (!slice->mbaff_frame_flag) {
		ret = slice->sgmap[mbaddr/2];
	} else {
		int x = mbaddr % slice->pic_width_in_mbs;
		int y = mbaddr / slice->pic_width_in_mbs;
		ret = slice->sgmap[y / 2 * slice->pic_width_in_mbs + x];
	}
	return ret;
}